

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::init(TextureCubeShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  *this_00;
  uint uVar1;
  deUint32 dVar2;
  int extraout_EAX;
  TextureCube *pTVar3;
  TextureCube *this_01;
  ulong uVar4;
  RenderTarget *pRVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> res_3;
  TextureFormat texFmt;
  float local_108;
  float fStack_104;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  int local_e0;
  RGBA local_d0;
  RGBA local_cc;
  Vec4 local_c8;
  Vec4 local_b8;
  ulong local_a0;
  undefined1 local_98 [12];
  float fStack_8c;
  Vec2 local_88;
  float fStack_80;
  float fStack_7c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vec4 local_48;
  TextureFormat local_38;
  
  uVar1 = this->m_size;
  if (uVar1 == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  local_38 = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_98,&local_38);
  pTVar3 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (pTVar3,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  this->m_gradientTex = pTVar3;
  this_01 = (TextureCube *)operator_new(0x180);
  pTVar3 = this_01;
  glu::TextureCube::TextureCube
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  uVar7 = 0x1f - uVar7;
  this->m_gridTex = this_01;
  local_f8 = (float)local_98._0_8_;
  fStack_f4 = SUB84(local_98._0_8_,4);
  fStack_f0 = local_98._8_4_;
  fStack_ec = local_98._12_4_;
  local_108 = local_88.m_data[0];
  fStack_104 = local_88.m_data[1];
  if (init()::gradients == '\0') {
    init((EVP_PKEY_CTX *)pTVar3);
  }
  local_108 = local_108 - local_f8;
  fStack_104 = fStack_104 - fStack_f4;
  fVar11 = fStack_80 - fStack_f0;
  fVar12 = fStack_7c - fStack_ec;
  lVar6 = 0;
  local_a0 = 0;
  if (0 < (int)uVar7) {
    local_a0 = (ulong)uVar7;
  }
  lVar9 = local_a0 * 0x28;
  do {
    if (uVar1 != 0) {
      lVar10 = 0;
      iVar8 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_gradientTex->m_refTexture,(CubeFace)lVar6,iVar8);
        local_b8.m_data[0] = init::gradients[lVar6][0].m_data[0] * local_108 + local_f8;
        local_b8.m_data[1] = init::gradients[lVar6][0].m_data[1] * fStack_104 + fStack_f4;
        local_b8.m_data[2] = init::gradients[lVar6][0].m_data[2] * fVar11 + fStack_f0;
        local_b8.m_data[3] = init::gradients[lVar6][0].m_data[3] * fVar12 + fStack_ec;
        local_c8.m_data[0] = init::gradients[lVar6][1].m_data[0] * local_108 + local_f8;
        local_c8.m_data[1] = init::gradients[lVar6][1].m_data[1] * fStack_104 + fStack_f4;
        local_c8.m_data[2] = init::gradients[lVar6][1].m_data[2] * fVar11 + fStack_f0;
        local_c8.m_data[3] = init::gradients[lVar6][1].m_data[3] * fVar12 + fStack_ec;
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   ((long)(this->m_gradientTex->m_refTexture).m_access[lVar6].
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar10),&local_b8,&local_c8);
        iVar8 = iVar8 + 1;
        lVar10 = lVar10 + 0x28;
      } while (lVar9 + 0x28 != lVar10);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar4 = local_a0 & 0xffffffff;
  lVar6 = 0;
  do {
    if (uVar1 != 0) {
      local_e0 = (int)(0xffffff / (ulong)(uVar7 * 6 + 6)) * (CubeFace)lVar6;
      lVar9 = 0;
      iVar8 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_gridTex->m_refTexture,(CubeFace)lVar6,iVar8);
        local_cc.m_value = iVar8 * local_e0 | 0xff000000;
        lVar10 = (long)(this->m_gridTex->m_refTexture).m_access[lVar6].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec(&local_cc);
        local_d0.m_value = ~(iVar8 * local_e0) | 0xff000000;
        local_b8.m_data[0] = local_c8.m_data[0] * local_108 + local_f8;
        local_b8.m_data[1] = local_c8.m_data[1] * fStack_104 + fStack_f4;
        local_b8.m_data[2] = local_c8.m_data[2] * fVar11 + fStack_f0;
        local_b8.m_data[3] = local_c8.m_data[3] * fVar12 + fStack_ec;
        tcu::RGBA::toVec(&local_d0);
        local_48.m_data[0] = local_58 * local_108 + local_f8;
        local_48.m_data[1] = fStack_54 * fStack_104 + fStack_f4;
        local_48.m_data[2] = fStack_50 * fVar11 + fStack_f0;
        local_48.m_data[3] = fStack_4c * fVar12 + fStack_ec;
        tcu::fillWithGrid((PixelBufferAccess *)(lVar10 + lVar9),4,&local_b8,&local_48);
        iVar8 = iVar8 + 1;
        lVar9 = lVar9 + 0x28;
      } while (uVar4 * 0x28 + 0x28 != lVar9);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  glu::TextureCube::upload(this->m_gradientTex);
  glu::TextureCube::upload(this->m_gridTex);
  dVar2 = this->m_compareFunc;
  if (dVar2 == 0x205 || dVar2 == 0x202) {
    fVar11 = 1.0;
  }
  else {
    fVar11 = 0.5;
  }
  local_108 = 0.0;
  if (dVar2 != 0x205 && dVar2 != 0x202) {
    local_108 = 0.5;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar5->m_numSamples;
  this_00 = &this->m_cases;
  if (iVar8 == 0) {
    local_98._0_8_ = this->m_gradientTex;
    local_98._8_4_ = -1.25;
    fStack_8c = -1.2;
    local_88.m_data[0] = 1.2;
    local_88.m_data[1] = 1.25;
  }
  else {
    local_98._0_8_ = this->m_gradientTex;
    local_98._8_4_ = -1.19;
    fStack_8c = -1.3;
    local_88.m_data[0] = 1.1;
    local_88.m_data[1] = 1.35;
  }
  fStack_80 = fVar11;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  local_98._0_8_ = this->m_gradientTex;
  local_98._8_4_ = 0.8;
  fStack_8c = 0.8;
  local_88.m_data[0] = 1.25;
  local_88.m_data[1] = 1.2;
  fStack_80 = local_108;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  local_98._0_8_ = this->m_gridTex;
  local_98._8_4_ = -1.19;
  fStack_8c = -1.3;
  local_88.m_data[0] = 1.1;
  local_88.m_data[1] = 1.35;
  fStack_80 = fVar11;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  local_98._0_8_ = this->m_gridTex;
  local_98._8_4_ = -1.2;
  fStack_8c = -1.1;
  local_88.m_data[0] = -0.8;
  local_88.m_data[1] = -0.8;
  fStack_80 = local_108;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  local_98._0_8_ = this->m_gridTex;
  local_98._8_4_ = -0.61;
  fStack_8c = -0.1;
  local_88.m_data[0] = 0.9;
  local_88.m_data[1] = 1.18;
  fStack_80 = 1.1;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  if (iVar8 == 0) {
    local_98._0_8_ = this->m_gridTex;
    local_88.m_data[0] = 0.05;
  }
  else {
    local_98._0_8_ = this->m_gridTex;
    local_88.m_data[0] = 0.25;
  }
  local_98._8_4_ = -0.75;
  fStack_8c = 1.0;
  local_88.m_data[1] = 0.75;
  fStack_80 = -0.1;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_98);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeShadowCase::init (void)
{
	try
	{
		DE_ASSERT(!m_gradientTex && !m_gridTex);

		int						numLevels	= deLog2Floor32(m_size)+1;
		tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		tcu::Vec4				cBias		= fmtInfo.valueMin;
		tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Create textures.
		m_gradientTex	= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);
		m_gridTex		= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);

		// Fill first with gradient texture.
		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_gradientTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				deUint32	rgb		= step*levelNdx*face;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_gridTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_gridTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureCubeShadowCase::deinit();
		throw;
	}

	// Compute cases
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;
		const float refOutOfBoundsLower	= -0.1f;
		const bool	singleSample		= m_context.getRenderTarget().getNumSamples() == 0;

		if (singleSample)
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f)));	// minification
		else
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification - w/ tuned coordinates to avoid hitting triangle edges

		m_cases.push_back(FilterCase(m_gradientTex,	refInRangeLower,		tcu::Vec2(0.8f, 0.8f), tcu::Vec2(1.25f, 1.20f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeUpper,		tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeLower,		tcu::Vec2(-1.2f, -1.1f), tcu::Vec2(-0.8f, -0.8f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refOutOfBoundsUpper,	tcu::Vec2(-0.61f, -0.1f), tcu::Vec2(0.9f, 1.18f)));	// reference value clamp, upper

		if (singleSample)
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.05f, 0.75f)));	// reference value clamp, lower
		else
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.25f, 0.75f)));	// reference value clamp, lower
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}